

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall maths::operator/(maths *this,Matrix *m,double num)

{
  double *pdVar1;
  double **extraout_RDX;
  long lVar2;
  ulong uVar3;
  Matrix MVar4;
  Matrix temp;
  Matrix local_28;
  double local_18;
  
  local_18 = num;
  Matrix::Matrix(&local_28,m);
  if (0 < (long)local_28.rows_) {
    lVar2 = 0;
    do {
      if (0 < local_28.cols_) {
        pdVar1 = local_28.p[lVar2];
        uVar3 = 0;
        do {
          pdVar1[uVar3] = pdVar1[uVar3] / local_18;
          uVar3 = uVar3 + 1;
        } while ((uint)local_28.cols_ != uVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != local_28.rows_);
  }
  Matrix::Matrix((Matrix *)this,&local_28);
  Matrix::~Matrix(&local_28);
  MVar4.p = extraout_RDX;
  MVar4._0_8_ = this;
  return MVar4;
}

Assistant:

Matrix operator/(const Matrix& m, double num)
{
    Matrix temp(m);
    return (temp /= num);
}